

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmartPtr.hpp
# Opt level: O2

SmartPtr<Kernel::Ordering> * __thiscall
Lib::SmartPtr<Kernel::Ordering>::operator=
          (SmartPtr<Kernel::Ordering> *this,SmartPtr<Kernel::Ordering> *ptr)

{
  Ordering *pOVar1;
  RefCounter *ptr_00;
  Ordering *pOVar2;
  RefCounter *pRVar3;
  
  pOVar1 = this->_obj;
  ptr_00 = this->_refCnt;
  pOVar2 = ptr->_obj;
  this->_obj = pOVar2;
  pRVar3 = ptr->_refCnt;
  this->_refCnt = pRVar3;
  if (pRVar3 != (RefCounter *)0x0 && pOVar2 != (Ordering *)0x0) {
    pRVar3->_val = pRVar3->_val + 1;
  }
  if ((ptr_00 != (RefCounter *)0x0 && pOVar1 != (Ordering *)0x0) &&
     (ptr_00->_val = ptr_00->_val + -1, ptr_00->_val == 0)) {
    (*pOVar1->_vptr_Ordering[1])();
    RefCounter::operator_delete(ptr_00,4);
  }
  return this;
}

Assistant:

SmartPtr& operator=(const SmartPtr& ptr)
  {
    T* oldObj=_obj;
    RefCounter* oldCnt=_refCnt;
    _obj=ptr._obj;
    _refCnt=ptr._refCnt;

    if(_obj && _refCnt) {
      (_refCnt->_val)++;
    }

    if(oldObj && oldCnt) {
      (oldCnt->_val)--;
      ASS(oldCnt->_val >= 0);
      if(! oldCnt->_val) {
        checked_delete(oldObj);
        delete oldCnt;
      }
    }
    return *this;
  }